

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::format_map_nested_array(void)

{
  iterator iVar1;
  iterator iVar2;
  basic_variable<std::allocator<char>_> *data_00;
  basic_variable<std::allocator<char>_> *local_280;
  basic_variable<std::allocator<char>_> *local_268;
  basic_variable<std::allocator<char>_> *local_250;
  undefined8 uStack_228;
  value_type expected [17];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  basic_variable<std::allocator<char>_> local_1e8;
  basic_variable<std::allocator<char>_> local_1b8;
  basic_variable<std::allocator<char>_> local_188;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 auStack_128 [40];
  basic_variable<std::allocator<char>_> *local_100;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 auStack_98 [32];
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  auStack_98._24_8_ = &local_78;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  local_100 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_100,"ABC");
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_100 = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_1e8,
             (nullable *)
             ((long)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1b8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_188,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_158,3.0);
  auStack_128._8_8_ = &local_1e8;
  auStack_128._16_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_128 + 8));
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  auStack_98._8_8_ = &local_f8;
  auStack_98._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_98 + 8));
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_48._0_8_ = &local_78;
  local_48._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_250 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_250 = local_250 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_250);
  } while (local_250 != &local_78);
  local_268 = (basic_variable<std::allocator<char>_> *)auStack_98;
  do {
    local_268 = local_268 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_268);
  } while (local_268 != &local_f8);
  local_280 = (basic_variable<std::allocator<char>_> *)auStack_128;
  do {
    local_280 = local_280 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_280);
  } while (local_280 != &local_1e8);
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10),
             (bintoken *)local_38,data_00);
  uStack_228 = 0x829243424103a99e;
  expected[0] = 0x81;
  expected[1] = '\x02';
  expected[2] = 0xc5;
  expected[3] = '\0';
  expected[4] = '\0';
  expected[5] = '@';
  expected[6] = '@';
  expected[7] = 0x93;
  expected[8] = 0x9f;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10));
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x17f,"void formatter_suite::format_map_nested_array()",iVar1._M_current,
             iVar2._M_current,&uStack_228,expected + 9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void format_map_nested_array()
{
    variable data =
        {
            { "ABC", { null, true, 2, 3.0f } }
        };
    auto result = bintoken::format<buffer_type>(data);
    const value_type expected[] = {
        bintoken::token::code::begin_assoc_array,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::begin_array,
        bintoken::token::code::null,
        bintoken::token::code::true_value,
        0x02,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::end_array,
        bintoken::token::code::end_assoc_array
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}